

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall boost::runtime::cla::parser::build_trie(parser *this,parameters_store *parameters)

{
  element_type *peVar1;
  shared_count sVar2;
  parameter_trie *__tmp;
  mapped_type *pmVar3;
  parameter_trie *p;
  _Rb_tree_header *p_Var4;
  char *__function;
  pointer pcVar5;
  element_type *peVar6;
  basic_param_ptr param;
  key_type local_b8;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_a8;
  element_type *local_90;
  shared_count sStack_88;
  element_type *local_80;
  shared_count local_78;
  _Base_ptr local_70;
  basic_param_ptr local_68;
  _Base_ptr local_58;
  _Base_ptr local_50;
  element_type *local_48;
  key_type local_40;
  
  local_50 = (parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_50 != local_58) {
    local_70 = (_Base_ptr)&this->m_param_trie;
    do {
      local_80 = (element_type *)local_50[1]._M_left;
      local_78.pi_ = (sp_counted_base *)local_50[1]._M_right;
      if ((_Base_ptr)local_78.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_78.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_78.pi_)->_M_parent + 1;
        UNLOCK();
      }
      if ((local_80 == (element_type *)0x0) || (local_80 == (element_type *)0x0)) {
LAB_001985aa:
        __function = 
        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
        ;
LAB_001985a0:
        __assert_fail("px != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                      ,0x2de,__function);
      }
      local_48 = (element_type *)
                 (local_80->m_cla_ids).
                 super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      peVar6 = (element_type *)
               (local_80->m_cla_ids).
               super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (peVar6 != local_48) {
        local_b8.m_begin = (((string *)&peVar6->_vptr_basic_param)->_M_dataplus)._M_p;
        local_b8.m_end = (peVar6->p_name)._M_dataplus._M_p + (long)local_b8.m_begin;
        pmVar3 = std::
                 map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                 ::operator[]((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                               *)local_70,&local_b8);
        local_a8.px = pmVar3->px;
        local_a8.pn.pi_ = (pmVar3->pn).pi_;
        if (local_a8.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_a8.pn.pi_)->use_count_ = (local_a8.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        if (local_a8.px == (element_type *)0x0) {
          p = (parameter_trie *)operator_new(0x60);
          p_Var4 = &(p->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
          (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
          (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
          (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          (p->m_id_candidates).
          super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (p->m_id_candidates).
          super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (p->m_id_candidates).
          super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (p->m_param_candidate).px = (element_type *)0x0;
          (p->m_param_candidate).pn.pi_ = (sp_counted_base *)0x0;
          p->m_has_final_candidate = false;
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
                    ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)&local_90,p);
          local_40.m_begin = (((string *)&peVar6->_vptr_basic_param)->_M_dataplus)._M_p;
          local_40.m_end =
               (peVar6->p_name)._M_dataplus._M_p +
               (long)&((sp_counted_base *)local_40.m_begin)->_vptr_sp_counted_base;
          pmVar3 = std::
                   map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                   ::operator[]((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                                 *)local_70,&local_40);
          sVar2.pi_ = sStack_88.pi_;
          peVar1 = local_90;
          local_90 = (element_type *)0x0;
          sStack_88.pi_ = (sp_counted_base *)0x0;
          local_b8.m_begin = (iterator)pmVar3->px;
          pmVar3->px = peVar1;
          local_b8.m_end = (iterator)(pmVar3->pn).pi_;
          (pmVar3->pn).pi_ = sVar2.pi_;
          detail::shared_count::~shared_count((shared_count *)&local_b8.m_end);
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                    (&local_a8,pmVar3);
          detail::shared_count::~shared_count(&sStack_88);
        }
        if ((peVar6->p_description)._M_dataplus._M_p != (pointer)0x0) {
          pcVar5 = (pointer)0x0;
          do {
            if (local_a8.px == (element_type *)0x0) {
LAB_0019858b:
              __function = 
              "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->() const [T = boost::runtime::cla::rt_cla_detail::parameter_trie]"
              ;
              goto LAB_001985a0;
            }
            rt_cla_detail::parameter_trie::make_subtrie
                      ((parameter_trie *)&local_90,(char)local_a8.px);
            sVar2.pi_ = sStack_88.pi_;
            peVar1 = local_90;
            local_b8.m_end = (iterator)local_a8.pn.pi_;
            local_b8.m_begin = (iterator)local_a8.px;
            local_90 = (element_type *)0x0;
            sStack_88.pi_ = (sp_counted_base *)0x0;
            local_a8.px = peVar1;
            local_a8.pn.pi_ = sVar2.pi_;
            detail::shared_count::~shared_count((shared_count *)&local_b8.m_end);
            detail::shared_count::~shared_count(&sStack_88);
            if (local_a8.px == (parameter_trie *)0x0) goto LAB_0019858b;
            local_68.px = local_80;
            local_68.pn.pi_ = local_78.pi_;
            if ((_Base_ptr)local_78.pi_ != (_Base_ptr)0x0) {
              LOCK();
              (local_78.pi_)->use_count_ = (local_78.pi_)->use_count_ + 1;
              UNLOCK();
            }
            rt_cla_detail::parameter_trie::add_candidate_id
                      (local_a8.px,(parameter_cla_id *)peVar6,&local_68,
                       pcVar5 == (peVar6->p_description)._M_dataplus._M_p + -1);
            detail::shared_count::~shared_count(&local_68.pn);
            pcVar5 = pcVar5 + 1;
          } while (pcVar5 < (peVar6->p_description)._M_dataplus._M_p);
        }
        detail::shared_count::~shared_count(&local_a8.pn);
        if ((local_80 == (element_type *)0x0) ||
           (peVar6 = (element_type *)&peVar6->p_env_var, local_80 == (element_type *)0x0))
        goto LAB_001985aa;
      }
      detail::shared_count::~shared_count(&local_78);
      local_50 = (_Base_ptr)std::_Rb_tree_increment(local_50);
    } while (local_50 != local_58);
  }
  return;
}

Assistant:

BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, parameters.all() ) {
            basic_param_ptr param = v.second;

            // Register all parameter's ids in trie.
            BOOST_TEST_FOREACH( parameter_cla_id const&, id, param->cla_ids() ) {
                // This is the trie corresponding to the prefix.
                trie_ptr next_trie = m_param_trie[id.m_prefix];
                if( !next_trie )
                    next_trie = m_param_trie[id.m_prefix] = trie_ptr( new rt_cla_detail::parameter_trie );

                // Build the trie, by following name's characters
                // and register this parameter as candidate on each level
                for( size_t index = 0; index < id.m_tag.size(); ++index ) {
                    next_trie = next_trie->make_subtrie( id.m_tag[index] );

                    next_trie->add_candidate_id( id, param, index == (id.m_tag.size() - 1) );
                }
            }
        }